

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseModule
          (Parser *this,AttrList attributes,SyntaxKind parentKind,bool *anyLocalModules)

{
  TimeScale TVar1;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> elements_01;
  Token endmodule_00;
  Token nameToken;
  AttrList attributes_00;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  bool bVar5;
  bool bVar6;
  TokenKind TVar7;
  TokenKind TVar8;
  SyntaxKind SVar9;
  uint n_;
  Parser *pPVar10;
  optional<slang::TimeScale> *poVar11;
  AnonymousProgramSyntax *pAVar12;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar13;
  size_t sVar14;
  group_type *pgVar15;
  value_type *pvVar16;
  equal_to<const_slang::syntax::SyntaxNode_*> *peVar17;
  raw_key_type *__y;
  pointer ppVar18;
  int in_ECX;
  undefined8 in_RDX;
  Token *in_RSI;
  ParserBase *in_RDI;
  byte *in_R8;
  ModuleDeclarationSyntax *result;
  NamedBlockClauseSyntax *endName;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endmodule;
  SyntaxKind savedDefinitionKind;
  Node node;
  SyntaxKind declKind;
  string_view name;
  TokenKind endKind;
  ModuleHeaderSyntax *header;
  Preprocessor *pp;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  SyntaxNode **k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffb58;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb68;
  TokenKind in_stack_fffffffffffffb6e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb78;
  ParserBase *pPVar19;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  NamedBlockClauseSyntax *in_stack_fffffffffffffb88;
  ModuleHeaderSyntax *pos0_00;
  Parser *in_stack_fffffffffffffb90;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  *this_00;
  Info *in_stack_fffffffffffffb98;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  *ptVar20;
  Info *in_stack_fffffffffffffba0;
  Parser *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 uVar21;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffbd0;
  AnonymousProgramSyntax *args;
  NamedBlockClauseSyntax *hash_00;
  SyntaxList<slang::syntax::MemberSyntax> *this_01;
  Parser *in_stack_fffffffffffffc90;
  pointer in_stack_fffffffffffffc98;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffca0;
  NamedBlockClauseSyntax *local_350;
  SyntaxList<slang::syntax::MemberSyntax> *local_348;
  undefined4 uStack_332;
  TimeScaleMagnitude TStack_32e;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_328;
  string_view local_310;
  TokenKind local_2fa;
  ModuleHeaderSyntax *local_2f8;
  Preprocessor *local_2f0;
  Token local_2d8;
  byte *local_2c8;
  undefined4 in_stack_fffffffffffffd40;
  SyntaxKind parentKind_00;
  TokenKind endKind_00;
  Parser *in_stack_fffffffffffffd60;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_288;
  undefined1 *local_270;
  Token *local_268;
  string_view *local_260;
  Parser *local_258;
  bool local_249 [25];
  iterator local_230;
  bool local_219 [25];
  iterator local_200;
  bool local_1e9;
  iterator local_1e8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1d8;
  size_t local_1c0;
  size_t local_1b8;
  basic_string_view<char,_std::char_traits<char>_> *local_1b0;
  string_view *local_1a8;
  Parser *local_1a0;
  uint local_194;
  value_type *local_190;
  value_type *local_188;
  uint local_17c;
  group_type *local_178;
  size_t local_170;
  pow2_quadratic_prober local_168;
  size_t local_158;
  size_t local_150;
  basic_string_view<char,_std::char_traits<char>_> *local_148;
  Parser *local_140;
  undefined1 *local_130;
  Token *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  Parser *in_stack_ffffffffffffff58;
  uint local_44;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_10;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  *local_8;
  
  local_2c8 = in_R8;
  pPVar19 = in_RDI;
  bVar5 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffb70._M_extent_value,
                           in_stack_fffffffffffffb6e);
  uVar21 = false;
  if (bVar5) {
    local_2d8 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68),
                                 (uint32_t)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    uVar21 = local_2d8.kind == Semicolon;
  }
  if ((bool)uVar21 == false) {
    local_2f0 = ParserBase::getPP(in_RDI);
    Preprocessor::pushDesignElementStack(local_2f0);
    local_2f8 = parseModuleHeader(in_stack_ffffffffffffff58);
    local_2fa = slang::syntax::SyntaxFacts::getModuleEndKind((local_2f8->moduleKeyword).kind);
    endKind_00 = (TokenKind)((ulong)in_RDX >> 0x30);
    parentKind_00 = (SyntaxKind)((ulong)pPVar19 >> 0x20);
    if (in_ECX != 0x55) {
      local_310 = Token::valueText((Token *)in_stack_fffffffffffffb70._M_extent_value);
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_310);
      endKind_00 = (TokenKind)((ulong)in_RDX >> 0x30);
      parentKind_00 = (SyntaxKind)((ulong)pPVar19 >> 0x20);
      if (!bVar5) {
        if ((*local_2c8 & 1) == 0) {
          SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::emplace_back<>(in_stack_fffffffffffffb58);
          *local_2c8 = 1;
        }
        pPVar10 = (Parser *)
                  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ::back((SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          *)&in_RDI[2].lastPoppedDelims.second);
        local_260 = &local_310;
        local_258 = pPVar10;
        local_1a8 = local_260;
        local_1a0 = pPVar10;
        local_1b0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                              ((basic_string_view<char,_std::char_traits<char>_> *)0x2f5cae);
        local_1b8 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                              ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)in_stack_fffffffffffffb60,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffb58);
        local_1c0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    *)in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58);
        local_148 = local_1b0;
        local_158 = local_1b8;
        in_stack_fffffffffffffbb8 = pPVar10;
        local_150 = local_1c0;
        local_140 = pPVar10;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_168,local_1c0);
        do {
          local_170 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_168);
          local_178 = boost::unordered::detail::foa::
                      table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)0x2f5d68);
          local_178 = local_178 + local_170;
          local_17c = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 CONCAT26(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68),
                                 (size_t)in_stack_fffffffffffffb60);
          if (local_17c != 0) {
            local_188 = boost::unordered::detail::foa::
                        table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    *)0x2f5db3);
            local_190 = local_188 + local_170 * 0xf;
            do {
              local_194 = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffba0 =
                   (Info *)boost::unordered::detail::foa::
                           table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)0x2f5e03);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)0x2f5e30);
              bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                 in_stack_fffffffffffffb78,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffb70._M_extent_value);
              endKind_00 = (TokenKind)((ulong)in_RDX >> 0x30);
              parentKind_00 = (SyntaxKind)((ulong)pPVar19 >> 0x20);
              if (bVar5) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::table_locator(&local_1d8,local_178,local_194,local_190 + local_194);
                goto LAB_002f5f24;
              }
              local_17c = local_17c - 1 & local_17c;
            } while (local_17c != 0);
          }
          bVar5 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58);
          endKind_00 = (TokenKind)((ulong)in_RDX >> 0x30);
          parentKind_00 = (SyntaxKind)((ulong)pPVar19 >> 0x20);
          if (bVar5) {
            memset(&local_1d8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::table_locator(&local_1d8);
            goto LAB_002f5f24;
          }
          bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_168,
                             (size_t)(in_stack_fffffffffffffbb8->super_ParserBase).window.
                                     tokenSource);
          endKind_00 = (TokenKind)((ulong)in_RDX >> 0x30);
          parentKind_00 = (SyntaxKind)((ulong)pPVar19 >> 0x20);
        } while (bVar5);
        memset(&local_1d8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::table_locator(&local_1d8);
LAB_002f5f24:
        bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_1d8);
        if (bVar5) {
          local_1e8 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::make_iterator((locator *)0x2f5f44);
          local_1e9 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_328,&local_1e8,&local_1e9);
        }
        else if (*(Info **)&(pPVar10->super_ParserBase).window.lastConsumed <
                 (pPVar10->super_ParserBase).window.currentToken.info) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                    ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (size_t)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70._M_extent_value,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT26(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68));
          local_200 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::make_iterator((locator *)0x2f5fc4);
          local_219[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_328,&local_200,local_219);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                    (in_stack_fffffffffffffbd0,CONCAT17(uVar21,in_stack_fffffffffffffbc8),
                     (basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
          local_230 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::make_iterator((locator *)0x2f602a);
          local_249[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_328,&local_230,local_249);
        }
      }
    }
    SVar9 = slang::syntax::SyntaxFacts::getModuleDeclarationKind((local_2f8->moduleKeyword).kind);
    TVar7 = Preprocessor::getDefaultNetType(local_2f0);
    TVar8 = Preprocessor::getUnconnectedDrive(local_2f0);
    bVar5 = Preprocessor::getCellDefine(local_2f0);
    poVar11 = Preprocessor::getTimeScale(local_2f0);
    TVar1 = (poVar11->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_payload._M_value;
    uStack_332 = CONCAT31(TVar1._0_3_,bVar5);
    TStack_32e = TVar1.precision.magnitude;
    bVar5 = (poVar11->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_engaged;
    TVar2 = in_RDI[3].lastPoppedDelims.second.kind;
    uVar3 = in_RDI[3].lastPoppedDelims.second.field_0x2;
    NVar4.raw = in_RDI[3].lastPoppedDelims.second.numFlags.raw;
    in_RDI[3].lastPoppedDelims.second.kind = (short)SVar9;
    in_RDI[3].lastPoppedDelims.second.field_0x2 = (char)(SVar9 >> 0x10);
    in_RDI[3].lastPoppedDelims.second.numFlags = (NumericTokenFlags)(char)(SVar9 >> 0x18);
    Token::Token((Token *)in_stack_fffffffffffffb60);
    parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseModule(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::syntax::SyntaxKind,bool&)::__0>
              (in_stack_fffffffffffffd60,endKind_00,in_RSI,parentKind_00,
               (anon_class_8_1_8991fb9c *)CONCAT44(in_ECX,in_stack_fffffffffffffd40));
    in_RDI[3].lastPoppedDelims.second.kind = TVar2;
    in_RDI[3].lastPoppedDelims.second.field_0x2 = uVar3;
    in_RDI[3].lastPoppedDelims.second.numFlags = (NumericTokenFlags)NVar4.raw;
    Preprocessor::popDesignElementStack(local_2f0);
    parseNamedBlockClause(in_stack_fffffffffffffbb8);
    nameToken.info = in_stack_fffffffffffffba0;
    nameToken._0_8_ = in_stack_fffffffffffffb98;
    checkBlockNames(in_stack_fffffffffffffb90,nameToken,in_stack_fffffffffffffb88);
    pPVar19 = in_RDI + 1;
    elements_00._M_ptr._6_2_ = in_stack_fffffffffffffb6e;
    elements_00._M_ptr._0_6_ = in_stack_fffffffffffffb68;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffb70._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (in_stack_fffffffffffffb60,elements_00);
    elements_01._M_ptr._6_2_ = in_stack_fffffffffffffb6e;
    elements_01._M_ptr._0_6_ = in_stack_fffffffffffffb68;
    elements_01._M_extent._M_extent_value = in_stack_fffffffffffffb70._M_extent_value;
    pos0_00 = local_2f8;
    slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffb60,elements_01);
    endmodule_00.info = in_stack_fffffffffffffb98;
    endmodule_00._0_8_ = in_stack_fffffffffffffb90;
    hash_00 = local_350;
    this_01 = local_348;
    pAVar12 = (AnonymousProgramSyntax *)
              slang::syntax::SyntaxFactory::moduleDeclaration
                        ((SyntaxFactory *)CONCAT44(SVar9,in_stack_fffffffffffffb80),
                         (SyntaxKind)((ulong)pPVar19 >> 0x20),
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         in_stack_fffffffffffffb70._M_extent_value,
                         (ModuleHeaderSyntax *)
                         CONCAT26(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68),local_348,
                         endmodule_00,local_350);
    this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
               *)&in_RDI[1].window.currentToken;
    local_270 = &stack0xfffffffffffffbd0;
    args = pAVar12;
    local_268 = (Token *)this_00;
    local_130 = local_270;
    local_128 = (Token *)this_00;
    pSVar13 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
              ::key_from<slang::syntax::SyntaxNode_const*>(local_270);
    sVar14 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
             ::hash_for<slang::syntax::SyntaxNode_const*>
                       ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                         *)local_348,(SyntaxNode **)local_350);
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                               *)local_348,(size_t)local_350);
    ptVar20 = this_00;
    local_20 = sVar14;
    local_10 = pSVar13;
    local_8 = this_00;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      sVar14 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      pgVar15 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                          *)0x2f6425);
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            CONCAT26(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68),
                            (size_t)local_348);
      if (local_44 != 0) {
        pvVar16 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                  ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                              *)0x2f6470);
        do {
          n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
          peVar17 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                            *)0x2f64c0);
          in_stack_fffffffffffffb68 = SUB86(peVar17,0);
          in_stack_fffffffffffffb6e = (TokenKind)((ulong)peVar17 >> 0x30);
          in_stack_fffffffffffffb70._M_extent_value = (size_t)local_10;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                ::
                key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>
                          ((pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>
                            *)0x2f64ed);
          bVar6 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                            ((equal_to<const_slang::syntax::SyntaxNode_*> *)
                             CONCAT26(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68),
                             (SyntaxNode **)in_stack_fffffffffffffb70._M_extent_value,__y);
          if (bVar6) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
            ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
                             *)&stack0xffffffffffffff58,pgVar15 + sVar14,n_,
                            pvVar16 + sVar14 * 0xf + (ulong)n_);
            goto LAB_002f65e1;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar6 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  local_348,(size_t)local_350);
      if (bVar6) {
        memset(&stack0xffffffffffffff58,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
        ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
                         *)&stack0xffffffffffffff58);
        goto LAB_002f65e1;
      }
      bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,(ptVar20->arrays).groups_size_mask);
    } while (bVar6);
    memset(&stack0xffffffffffffff58,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
    ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
                     *)&stack0xffffffffffffff58);
LAB_002f65e1:
    bVar6 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&stack0xffffffffffffff58);
    if (bVar6) {
      local_b8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                 ::make_iterator((locator *)0x2f6601);
      local_b9 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_b8,&local_b9);
    }
    else if ((this_00->size_ctrl).size < (this_00->size_ctrl).ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (this_00,(size_t)pos0_00,CONCAT44(SVar9,in_stack_fffffffffffffb80),
                 (try_emplace_args_t *)pPVar19,
                 (SyntaxNode **)in_stack_fffffffffffffb70._M_extent_value);
      local_d0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                 ::make_iterator((locator *)0x2f6689);
      local_e9[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_d0,local_e9);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                  *)this_01,(size_t)hash_00,(try_emplace_args_t *)args,
                 (SyntaxNode **)CONCAT17(uVar21,in_stack_fffffffffffffbc8));
      local_100 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                  ::make_iterator((locator *)0x2f66f7);
      local_119[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_100,local_119);
    }
    ppVar18 = boost::unordered::detail::foa::
              table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
              ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)local_348);
    *(ulong *)&ppVar18->second = CONCAT44(uStack_332,CONCAT22(TVar8,TVar7));
    *(ushort *)
     ((long)&(ppVar18->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>.
             _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.precision
     + 1) = CONCAT11(bVar5,TStack_32e);
  }
  else {
    attributes_00._M_extent._M_extent_value = in_stack_fffffffffffffca0._M_extent_value;
    attributes_00._M_ptr = in_stack_fffffffffffffc98;
    pAVar12 = parseAnonymousProgram(in_stack_fffffffffffffc90,attributes_00);
  }
  return &pAVar12->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseModule(AttrList attributes, SyntaxKind parentKind,
                                  bool& anyLocalModules) {
    if (peek(TokenKind::ProgramKeyword) && peek(1).kind == TokenKind::Semicolon)
        return parseAnonymousProgram(attributes);

    // Tell the preprocessor that we're inside a design element for the duration of this function.
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto& header = parseModuleHeader();
    auto endKind = getModuleEndKind(header.moduleKeyword.kind);

    // If the parent isn't a compilation unit, that means we're a nested definition.
    // Record our name in the decl stack so that child instantiations know they're
    // referencing a local module and not a global one.
    if (parentKind != SyntaxKind::CompilationUnit) {
        auto name = header.name.valueText();
        if (!name.empty()) {
            if (!anyLocalModules) {
                moduleDeclStack.emplace_back();
                anyLocalModules = true;
            }
            moduleDeclStack.back().emplace(name);
        }
    }

    SyntaxKind declKind = getModuleDeclarationKind(header.moduleKeyword.kind);
    ParserMetadata::Node node{pp.getDefaultNetType(), pp.getUnconnectedDrive(), pp.getCellDefine(),
                              pp.getTimeScale()};

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = declKind;

    Token endmodule;
    auto members = parseMemberList<MemberSyntax>(
        endKind, endmodule, declKind, [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;
    pp.popDesignElementStack();

    auto endName = parseNamedBlockClause();
    checkBlockNames(header.name, endName);

    auto& result = factory.moduleDeclaration(declKind, attributes, header, members, endmodule,
                                             endName);

    meta.nodeMap[&result] = node;
    return result;
}